

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

int __thiscall
CVmObjGramProd::getp_clearAlts(CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  char *pcVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  vm_obj_id_t obj;
  uint uVar6;
  
  if (oargc == (uint *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *oargc;
  }
  if (getp_clearAlts(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar4 = __cxa_guard_acquire(&getp_clearAlts(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar4 != 0) {
      getp_clearAlts::desc.min_argc_ = 0;
      getp_clearAlts::desc.opt_argc_ = 1;
      getp_clearAlts::desc.varargs_ = 0;
      __cxa_guard_release(&getp_clearAlts(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&getp_clearAlts::desc);
  if (iVar4 == 0) {
    obj = 0;
    if (0 < (int)uVar6) {
      obj = 0;
      if (sp_[-1].typ != VM_NIL) {
        if (sp_[-1].typ != VM_OBJ) {
LAB_002866b2:
          err_throw(0x900);
        }
        obj = sp_[-1].val.obj;
        iVar4 = CVmObjDict::is_dictionary_obj(obj);
        if (iVar4 == 0) goto LAB_002866b2;
      }
    }
    for (uVar5 = 0; pvVar3 = sp_, pcVar1 = (this->super_CVmObject).ext_,
        uVar5 < *(ulong *)(pcVar1 + 0x38); uVar5 = uVar5 + 1) {
      *(undefined4 *)(*(long *)(*(long *)(pcVar1 + 0x30) + uVar5 * 8) + 8) = 1;
    }
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar3->val).obj = self;
    delete_marked_alts(this,self,obj);
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    sp_ = sp_ + (int)~uVar6;
  }
  return 1;
}

Assistant:

int CVmObjGramProd::getp_clearAlts(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *oargc)
{
    const vm_val_t *v;

    /* check arguments */
    int argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the dictionary object, if specified */
    vm_obj_id_t dict = VM_INVALID_OBJ;
    if (argc >= 1
        && (v = G_stk->get(0))->typ != VM_NIL
        && (v->typ != VM_OBJ
            || !CVmObjDict::is_dictionary_obj(vmg_ dict = v->val.obj)))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* mark every alternative for deletion */
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i)
        get_ext()->alts_[i]->del = TRUE;

    /* save 'self' for gc protection */
    G_interpreter->push_obj(vmg_ self);

    /* delete the batch */
    delete_marked_alts(vmg_ self, dict);

    /* return self */
    retval->set_obj(self);

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}